

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O3

Pdr_Set_t * Pdr_ManTernarySim(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vPiLits;
  Vec_Int_t *vCiObjs;
  Pdr_Man_t *p_00;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Vec_Int_t *vNodes;
  Vec_Int_t *vUndo;
  Vec_Int_t *vVis;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  Pdr_Set_t *pPVar9;
  uint uVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  Pdr_Man_t *pPVar14;
  FILE *pFVar15;
  Aig_Man_t *pAVar16;
  ulong uVar17;
  ulong uVar18;
  Aig_Obj_t *pAVar19;
  
  pVVar4 = p->vPrio;
  vPiLits = p->vLits;
  vCiObjs = p->vCiObjs;
  p_00 = (Pdr_Man_t *)p->vCoObjs;
  vValues = p->vCiVals;
  vValues_00 = p->vCoVals;
  vNodes = p->vNodes;
  vUndo = p->vUndo;
  vVis = p->vVisits;
  p_01 = p->vCi2Rem;
  p_02 = p->vRes;
  *(int *)((long)&p_00->pPars + 4) = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar7 = p->iOutCur;
    if (((long)iVar7 < 0) || (pVVar5 = p->pAig->vCos, pVVar5->nSize <= iVar7)) {
LAB_005fde76:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pPVar14 = p_00;
    Vec_IntPush((Vec_Int_t *)p_00,*(int *)((long)pVVar5->pArray[iVar7] + 0x24));
  }
  else {
    iVar7 = pCube->nLits;
    pPVar14 = p;
    if (0 < iVar7) {
      lVar12 = 0;
      do {
        if (*(int *)(&pCube->field_0x14 + lVar12 * 4) != -1) {
          uVar10 = (*(int *)(&pCube->field_0x14 + lVar12 * 4) >> 1) + p->pAig->nTruePos;
          if (((int)uVar10 < 0) || (pVVar5 = p->pAig->vCos, pVVar5->nSize <= (int)uVar10))
          goto LAB_005fde76;
          pPVar14 = p_00;
          Vec_IntPush((Vec_Int_t *)p_00,*(int *)((long)pVVar5->pArray[uVar10] + 0x24));
          iVar7 = pCube->nLits;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar7);
    }
  }
  iVar7 = (int)pPVar14;
  if (p->pPars->fVeryVerbose != 0) {
    Abc_Print(iVar7,"Trying to justify cube ");
    if (pCube == (Pdr_Set_t *)0x0) {
      Abc_Print(iVar7,"<prop=fail>");
    }
    else {
      pFVar15 = _stdout;
      Pdr_SetPrint(_stdout,pCube,p->pAig->nRegs,(Vec_Int_t *)0x0);
      iVar7 = (int)pFVar15;
    }
    Abc_Print(iVar7," in frame %d.\n",(ulong)(uint)k);
  }
  Pdr_ManCollectCone(p->pAig,(Vec_Int_t *)p_00,vCiObjs,vNodes);
  Pdr_ManCollectValues(p,k,vCiObjs,vValues);
  Pdr_ManCollectValues(p,k,(Vec_Int_t *)p_00,vValues_00);
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs,vValues,(Vec_Int_t *)0x0);
  }
  iVar7 = Pdr_ManSimDataInit(p->pAig,vCiObjs,vValues,vNodes,(Vec_Int_t *)p_00,vValues_00,
                             (Vec_Int_t *)0x0);
  if (iVar7 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x195,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  if (p->pPars->fFlopPrio == 0) {
    p_01->nSize = 0;
    if (0 < vCiObjs->nSize) {
      lVar12 = 0;
      do {
        pAVar16 = p->pAig;
        pVVar5 = pAVar16->vObjs;
        if (pVVar5 == (Vec_Ptr_t *)0x0) {
          pAVar19 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar10 = vCiObjs->pArray[lVar12];
          if (((int)uVar10 < 0) || (pVVar5->nSize <= (int)uVar10)) goto LAB_005fde76;
          pAVar19 = (Aig_Obj_t *)pVVar5->pArray[uVar10];
        }
        if ((*(uint *)&pAVar19->field_0x18 & 7) == 2) {
          uVar10 = (pAVar19->field_0).CioId - pAVar16->nTruePis;
          if (pAVar16->nTruePis <= (pAVar19->field_0).CioId) {
            if (((int)uVar10 < 0) || (pVVar4->nSize <= (int)uVar10)) goto LAB_005fde57;
            if (pVVar4->pArray[uVar10] == 0) {
              vUndo->nSize = 0;
              iVar7 = Pdr_ManExtendOne(pAVar16,pAVar19,vUndo,vVis);
              if (iVar7 == 0) {
                Pdr_ManExtendUndo(p->pAig,vUndo);
              }
              else {
                Vec_IntPush(p_01,pAVar19->Id);
              }
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < vCiObjs->nSize);
      if (0 < vCiObjs->nSize) {
        lVar12 = 0;
        do {
          pAVar16 = p->pAig;
          pVVar5 = pAVar16->vObjs;
          if (pVVar5 == (Vec_Ptr_t *)0x0) {
            pAVar19 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar10 = vCiObjs->pArray[lVar12];
            if (((int)uVar10 < 0) || (pVVar5->nSize <= (int)uVar10)) goto LAB_005fde76;
            pAVar19 = (Aig_Obj_t *)pVVar5->pArray[uVar10];
          }
          if ((*(uint *)&pAVar19->field_0x18 & 7) == 2) {
            uVar10 = (pAVar19->field_0).CioId - pAVar16->nTruePis;
            if (pAVar16->nTruePis <= (pAVar19->field_0).CioId) {
              if (((int)uVar10 < 0) || (pVVar4->nSize <= (int)uVar10)) goto LAB_005fde57;
              if (pVVar4->pArray[uVar10] != 0) {
                vUndo->nSize = 0;
                iVar7 = Pdr_ManExtendOne(pAVar16,pAVar19,vUndo,vVis);
                if (iVar7 == 0) {
                  Pdr_ManExtendUndo(p->pAig,vUndo);
                }
                else {
                  Vec_IntPush(p_01,pAVar19->Id);
                }
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vCiObjs->nSize);
      }
    }
  }
  else {
    p_02->nSize = 0;
    iVar7 = vCiObjs->nSize;
    if (0 < iVar7) {
      lVar12 = 0;
      do {
        pVVar5 = p->pAig->vObjs;
        if (pVVar5 == (Vec_Ptr_t *)0x0) {
          piVar11 = (int *)0x0;
        }
        else {
          uVar10 = vCiObjs->pArray[lVar12];
          if (((int)uVar10 < 0) || (pVVar5->nSize <= (int)uVar10)) goto LAB_005fde76;
          piVar11 = (int *)pVVar5->pArray[uVar10];
        }
        if (((piVar11[6] & 7U) == 2) && (iVar2 = p->pAig->nTruePis, iVar2 <= *piVar11)) {
          Vec_IntPush(p_02,*piVar11 - iVar2);
          iVar7 = vCiObjs->nSize;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar7);
      iVar7 = p_02->nSize;
      if (1 < (long)iVar7) {
        piVar11 = p_02->pArray;
        uVar13 = 1;
        uVar8 = 0;
        do {
          uVar1 = uVar8 + 1;
          uVar18 = uVar8 & 0xffffffff;
          uVar17 = uVar13;
          do {
            iVar2 = piVar11[uVar17];
            if (((long)iVar2 < 0) || (pVVar4->nSize <= iVar2)) goto LAB_005fde57;
            uVar10 = piVar11[(int)uVar18];
            if (((long)(int)uVar10 < 0) || ((uint)pVVar4->nSize <= uVar10)) goto LAB_005fde57;
            uVar6 = uVar17 & 0xffffffff;
            if (pVVar4->pArray[(int)uVar10] <= pVVar4->pArray[iVar2]) {
              uVar6 = uVar18;
            }
            uVar18 = uVar6;
            uVar17 = uVar17 + 1;
          } while ((long)iVar7 != uVar17);
          iVar2 = piVar11[uVar8];
          piVar11[uVar8] = piVar11[(int)uVar18];
          piVar11[(int)uVar18] = iVar2;
          uVar13 = uVar13 + 1;
          uVar8 = uVar1;
        } while (uVar1 != iVar7 - 1);
      }
    }
    p_01->nSize = 0;
    if (0 < p_02->nSize) {
      lVar12 = 0;
      do {
        pAVar16 = p->pAig;
        uVar10 = p_02->pArray[lVar12] + pAVar16->nTruePis;
        if (((int)uVar10 < 0) || (pAVar16->vCis->nSize <= (int)uVar10)) goto LAB_005fde76;
        pAVar19 = (Aig_Obj_t *)pAVar16->vCis->pArray[uVar10];
        if (((*(uint *)&pAVar19->field_0x18 & 7) != 2) ||
           ((pAVar19->field_0).CioId < pAVar16->nTruePis)) {
          __assert_fail("Saig_ObjIsLo( p->pAig, pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                        ,0x1aa,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
        }
        vUndo->nSize = 0;
        iVar7 = Pdr_ManExtendOne(pAVar16,pAVar19,vUndo,vVis);
        if (iVar7 == 0) {
          Pdr_ManExtendUndo(p->pAig,vUndo);
        }
        else {
          Vec_IntPush(p_01,pAVar19->Id);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < p_02->nSize);
    }
  }
  pAVar16 = p->pAig;
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(pAVar16,vCiObjs,vValues,p_01);
    pAVar16 = p->pAig;
  }
  iVar7 = Pdr_ManSimDataInit(pAVar16,vCiObjs,vValues,vNodes,(Vec_Int_t *)p_00,vValues_00,p_01);
  if (iVar7 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x1d6,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  Pdr_ManDeriveResult(p->pAig,vCiObjs,vValues,p_01,p_02,vPiLits);
  uVar8 = (ulong)(uint)p_02->nSize;
  if (p_02->nSize < 1) {
    __assert_fail("Vec_IntSize(vRes) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x1da,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  if ((p->pPars->fUseAbs != 0) && (p->vAbsFlops != (Vec_Int_t *)0x0)) {
    lVar12 = 0;
    uVar10 = 0;
    do {
      uVar3 = p_02->pArray[lVar12];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->vAbsFlops->nSize <= (int)(uVar3 >> 1)) {
LAB_005fde57:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vAbsFlops->pArray[uVar3 >> 1] == 0) {
        Vec_IntPush(vPiLits,uVar3 + p->pAig->nTruePis * 2);
      }
      else {
        if (((int)uVar10 < 0) || ((uint)uVar8 <= uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar8 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        p_02->pArray[uVar8] = uVar3;
      }
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)p_02->nSize;
    } while (lVar12 < (long)uVar8);
    if (p_02->nSize < (int)uVar10) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    p_02->nSize = uVar10;
  }
  pPVar9 = Pdr_SetCreate(p_02,vPiLits);
  return pPVar9;
}

Assistant:

Pdr_Set_t * Pdr_ManTernarySim( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pRes;
    Vec_Int_t * vPrio   = p->vPrio;    // priority flops (flop indices)
    Vec_Int_t * vPiLits = p->vLits;    // array of literals (0/1 PI values)
    Vec_Int_t * vCiObjs = p->vCiObjs;  // cone leaves (CI obj IDs)
    Vec_Int_t * vCoObjs = p->vCoObjs;  // cone roots (CO obj IDs)
    Vec_Int_t * vCiVals = p->vCiVals;  // cone leaf values (0/1 CI values)
    Vec_Int_t * vCoVals = p->vCoVals;  // cone root values (0/1 CO values)
    Vec_Int_t * vNodes  = p->vNodes;   // cone nodes (node obj IDs)
    Vec_Int_t * vUndo   = p->vUndo;    // cone undos (node obj IDs)
    Vec_Int_t * vVisits = p->vVisits;  // intermediate (obj IDs)
    Vec_Int_t * vCi2Rem = p->vCi2Rem;  // CIs to be removed (CI obj IDs)
    Vec_Int_t * vRes    = p->vRes;     // final result (flop literals)
    Aig_Obj_t * pObj;
    int i, Entry, RetValue;
    //abctime clk = Abc_Clock();

    // collect CO objects
    Vec_IntClear( vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
//        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, (p->pPars->iOutput==-1)?0:p->pPars->iOutput)) );
        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, p->iOutCur)) );
    }
    else // the target is the cube
    {
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Saig_ManLi(p->pAig, (pCube->Lits[i] >> 1));
            Vec_IntPush( vCoObjs, Aig_ObjId(pObj) );
        }
    }
if ( p->pPars->fVeryVerbose )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Aig_ManRegNum(p->pAig), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Pdr_ManCollectCone( p->pAig, vCoObjs, vCiObjs, vNodes );
    // collect values
    Pdr_ManCollectValues( p, k, vCiObjs, vCiVals );
    Pdr_ManCollectValues( p, k, vCoObjs, vCoVals );
    // simulate for the first time
if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, NULL );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, NULL );
    assert( RetValue );

    // iteratively remove flops
    if ( p->pPars->fFlopPrio )
    {
        // collect flops and sort them by priority
        Vec_IntClear( vRes );
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            Vec_IntPush( vRes, Entry );
        }
        Vec_IntSelectSortCost( Vec_IntArray(vRes), Vec_IntSize(vRes), vPrio );

        // try removing flops starting from low-priority to high-priority
        Vec_IntClear( vCi2Rem );
        Vec_IntForEachEntry( vRes, Entry, i )
        {
            pObj = Aig_ManCi( p->pAig, Saig_ManPiNum(p->pAig) + Entry );
            assert( Saig_ObjIsLo( p->pAig, pObj ) );
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
    }
    else
    {
        // try removing low-priority flops first
        Vec_IntClear( vCi2Rem );
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            if ( Vec_IntEntry(vPrio, Entry) )
                continue;
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
        // try removing high-priority flops next
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            if ( !Vec_IntEntry(vPrio, Entry) )
                continue;
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
    }

if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, vCi2Rem );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, vCi2Rem );
    assert( RetValue );

    // derive the set of resulting registers
    Pdr_ManDeriveResult( p->pAig, vCiObjs, vCiVals, vCi2Rem, vRes, vPiLits );
    assert( Vec_IntSize(vRes) > 0 );
    //p->tTsim += Abc_Clock() - clk;

    // move abstracted literals from flops to inputs
    if ( p->pPars->fUseAbs && p->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( vRes, iLit, i )
        {
            if ( Vec_IntEntry(p->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( vRes, k++, iLit );
            else
                Vec_IntPush( vPiLits, 2*Saig_ManPiNum(p->pAig) + iLit );
        }
        Vec_IntShrink( vRes, k );
    }
    pRes = Pdr_SetCreate( vRes, vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    //assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}